

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

list<int,_std::allocator<int>_> * __thiscall
imrt::Station::closed_beamlets_abi_cxx11_
          (list<int,_std::allocator<int>_> *__return_storage_ptr__,Station *this,int a)

{
  size_t *psVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  pair<int,_int> pVar5;
  mapped_type *pmVar6;
  _List_node_base *p_Var7;
  key_type kVar8;
  long lVar9;
  uint uVar10;
  key_type local_38;
  
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size = 0;
  lVar9 = 0;
  while( true ) {
    iVar4 = Collimator::getXdim(this->collimator);
    if (iVar4 <= lVar9) break;
    pVar5 = Collimator::getActiveRange(this->collimator,(int)lVar9,this->angle);
    uVar10 = pVar5.first;
    if ((int)uVar10 <= pVar5.second && -1 < (int)uVar10) {
      kVar8 = (key_type)(((ulong)(uVar10 & 0x7fffffff) << 0x20) + lVar9);
      uVar10 = uVar10 & 0x7fffffff;
      do {
        lVar2 = *(long *)&(this->A).
                          super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[a].
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data;
        if (((int)uVar10 < *(int *)(lVar2 + lVar9 * 8)) ||
           (*(int *)(lVar2 + 4 + lVar9 * 8) < (int)uVar10)) {
          local_38 = kVar8;
          pmVar6 = std::
                   map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                   ::operator[](&this->pos2beam,&local_38);
          p_Var7 = (_List_node_base *)operator_new(0x18);
          *(mapped_type *)&p_Var7[1]._M_next = *pmVar6;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        kVar8 = (key_type)((long)kVar8 + 0x100000000);
        bVar3 = (int)uVar10 < pVar5.second;
        uVar10 = uVar10 + 1;
      } while (bVar3);
    }
    lVar9 = lVar9 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

list<int> Station::closed_beamlets(int a){
	  list<int> ob;
	  pair <int,int>aux;
    for (int i=0; i < collimator.getXdim(); i++) {
      aux = collimator.getActiveRange(i,angle);
      if (aux.first<0) continue;
      for (int j=aux.first; j<=aux.second; j++)
        if (j<A[a][i].first || j>A[a][i].second)
        	 ob.push_back(pos2beam[make_pair(i,j)]);
    }
    return ob;
  }